

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tail_calls_check.cpp
# Opt level: O0

bool skiwi::only_tail_calls(Program *prog)

{
  undefined8 this;
  bool bVar1;
  reference local_58;
  reference local_50;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  iterator __end1;
  iterator __begin1;
  Expressions *__range1;
  tail_calls_check_helper tcch;
  Program *prog_local;
  
  tcch._24_8_ = prog;
  if ((prog->tail_call_analysis & 1U) != 0) {
    anon_unknown_24::tail_calls_check_helper::tail_calls_check_helper
              ((tail_calls_check_helper *)&__range1);
    this = tcch._24_8_;
    __end1 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::begin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                      *)tcch._24_8_);
    expr = (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
            *)std::
              vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              ::end((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                     *)this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                  *)&expr);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                 ::operator*(&__end1);
      local_50 = local_58;
      std::
      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*>_>
      ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*>_>
                   *)&__range1,&local_58);
      __gnu_cxx::
      __normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
      ::operator++(&__end1);
    }
    anon_unknown_24::tail_calls_check_helper::treat_expressions
              ((tail_calls_check_helper *)&__range1);
    anon_unknown_24::tail_calls_check_helper::~tail_calls_check_helper
              ((tail_calls_check_helper *)&__range1);
    return (bool)((byte)tcch.expressions.
                        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 1);
  }
  __assert_fail("prog.tail_call_analysis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/tail_calls_check.cpp"
                ,0xae,"bool skiwi::only_tail_calls(Program &)");
}

Assistant:

bool only_tail_calls(Program& prog)
  {
  assert(prog.tail_call_analysis);
  //tail_calls_check tcc;
  //visitor<Program, tail_calls_check>::visit(prog, &tcc);

  tail_calls_check_helper tcch;
  for (auto& expr : prog.expressions)
    tcch.expressions.push_back(&expr);

  tcch.treat_expressions();

  return tcch.only_tails;
  }